

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O3

error_info * __thiscall
toml::make_error_info<char_const(&)[65]>
          (error_info *__return_storage_ptr__,toml *this,string *title,source_location *loc,
          string *msg,char (*tail) [65])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_t sVar5;
  error_info ei;
  char *local_1d8;
  size_type local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  error_info local_100;
  pointer local_a8;
  size_type sStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)this == paVar1) {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160.field_2._8_8_ = *(undefined8 *)(this + 0x18);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)this;
  }
  local_160._M_string_length = *(size_type *)(this + 8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)this = paVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (toml)0x0;
  local_a8 = (title->_M_dataplus)._M_p;
  sStack_a0 = title->_M_string_length;
  local_98 = *(undefined4 *)&title->field_2;
  uStack_94 = *(undefined4 *)((long)&title->field_2 + 4);
  uStack_90 = *(undefined4 *)((long)&title->field_2 + 8);
  uStack_8c = *(undefined4 *)((long)&title->field_2 + 0xc);
  local_88 = *(undefined4 *)&title[1]._M_dataplus._M_p;
  uStack_84 = *(undefined4 *)((long)&title[1]._M_dataplus._M_p + 4);
  uStack_80 = (undefined4)title[1]._M_string_length;
  uStack_7c = *(undefined4 *)((long)&title[1]._M_string_length + 4);
  local_78 = *(undefined4 *)&title[1].field_2;
  uStack_74 = *(undefined4 *)((long)&title[1].field_2 + 4);
  uStack_70 = *(undefined4 *)((long)&title[1].field_2 + 8);
  uStack_6c = *(undefined4 *)((long)&title[1].field_2 + 0xc);
  local_68._M_p = (pointer)&local_58;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)title[2]._M_dataplus._M_p;
  paVar1 = &title[2].field_2;
  if (paVar4 == paVar1) {
    local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58._8_8_ = *(undefined8 *)((long)&title[2].field_2 + 8);
  }
  else {
    local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68._M_p = (pointer)paVar4;
  }
  local_60 = title[2]._M_string_length;
  title[2]._M_dataplus._M_p = (pointer)paVar1;
  title[2]._M_string_length = 0;
  title[2].field_2._M_local_buf[0] = '\0';
  local_48 = (pointer)title[3]._M_dataplus._M_p;
  pbStack_40 = (pointer)title[3]._M_string_length;
  local_38 = (pointer)title[3].field_2._M_allocated_capacity;
  title[3].field_2._M_allocated_capacity = 0;
  title[3]._M_dataplus._M_p = (pointer)0x0;
  title[3]._M_string_length = 0;
  psVar2 = &loc->first_column_;
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)loc ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_180.field_2._M_allocated_capacity = *psVar2;
    local_180.field_2._8_4_ = (undefined4)loc->first_offset_;
    local_180.field_2._12_4_ = *(undefined4 *)((long)&loc->first_offset_ + 4);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar2;
    local_180._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)loc;
  }
  local_180._M_string_length = loc->first_line_;
  *(size_t **)loc = psVar2;
  loc->first_line_ = 0;
  *(undefined1 *)&loc->first_column_ = 0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  error_info::error_info(&local_100,&local_160,(source_location *)&local_a8,&local_180,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_100.title_._M_dataplus._M_p,
             local_100.title_._M_dataplus._M_p + local_100.title_._M_string_length);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1b8,&local_100.locations_);
  paVar3 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_100.suffix_._M_dataplus._M_p,
             local_100.suffix_._M_dataplus._M_p + local_100.suffix_._M_string_length);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  sVar5 = strlen((char *)msg);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,msg,(long)&(msg->_M_dataplus)._M_p + sVar5);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_1a0,&local_140);
  paVar1 = &(__return_storage_ptr__->title_).field_2;
  (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_1d8 == &local_1c8) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
    *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_1c0;
  }
  else {
    (__return_storage_ptr__->title_)._M_dataplus._M_p = local_1d8;
    (__return_storage_ptr__->title_).field_2._M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
  }
  (__return_storage_ptr__->title_)._M_string_length = local_1d0;
  local_1d0 = 0;
  local_1c8 = '\0';
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(__return_storage_ptr__->suffix_).field_2;
  (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p == paVar3) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,local_1a0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = local_1a0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_1a0._M_dataplus._M_p;
    (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity =
         CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,local_1a0.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->suffix_)._M_string_length = local_1a0._M_string_length;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_1d8 = &local_1c8;
  local_1a0._M_dataplus._M_p = (pointer)paVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a0._M_dataplus._M_p,
                      CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                               local_1a0.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b8);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.suffix_._M_dataplus._M_p != &local_100.suffix_.field_2) {
    operator_delete(local_100.suffix_._M_dataplus._M_p,
                    local_100.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_100.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.title_._M_dataplus._M_p != &local_100.title_.field_2) {
    operator_delete(local_100.title_._M_dataplus._M_p,
                    local_100.title_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}